

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_ctl.c
# Opt level: O2

t_int * vsnapshot_tilde_perform(t_int *w)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  
  lVar1 = w[1];
  lVar2 = w[2];
  lVar3 = *(long *)(lVar2 + 0x38);
  uVar5 = 0;
  uVar4 = (ulong)*(uint *)(lVar2 + 0x30);
  if ((int)*(uint *)(lVar2 + 0x30) < 1) {
    uVar4 = uVar5;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    *(undefined4 *)(lVar3 + uVar5 * 4) = *(undefined4 *)(lVar1 + uVar5 * 4);
  }
  dVar6 = clock_getlogicaltime();
  *(double *)(lVar2 + 0x48) = dVar6;
  *(undefined4 *)(lVar2 + 0x34) = 1;
  return w + 3;
}

Assistant:

static t_int *vsnapshot_tilde_perform(t_int *w)
{
    t_sample *in = (t_sample *)(w[1]);
    t_vsnapshot *x = (t_vsnapshot *)(w[2]);
    t_sample *out = x->x_vec;
    int n = x->x_n, i;
    for (i = 0; i < n; i++)
        out[i] = in[i];
    x->x_time = clock_getlogicaltime();
    x->x_gotone = 1;
    return (w+3);
}